

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O2

SteadyTimer __thiscall
miniros::NodeHandle::createSteadyTimer
          (NodeHandle *this,WallDuration *period,SteadyTimerCallback *callback,bool oneshot,
          bool autostart)

{
  undefined7 in_register_00000009;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SteadyTimer SVar1;
  SteadyTimerOptions ops;
  SteadyTimerOptions local_78;
  
  SteadyTimerOptions::SteadyTimerOptions(&local_78);
  local_78.period.super_DurationBase<miniros::WallDuration> =
       *(DurationBase<miniros::WallDuration> *)&(callback->super__Function_base)._M_functor;
  std::function<void_(const_miniros::SteadyTimerEvent_&)>::operator=
            (&local_78.callback,
             (function<void_(const_miniros::SteadyTimerEvent_&)> *)
             CONCAT71(in_register_00000009,oneshot));
  local_78.oneshot = autostart;
  createSteadyTimer(this,(SteadyTimerOptions *)period);
  SteadyTimerOptions::~SteadyTimerOptions(&local_78);
  SVar1.impl_.super___shared_ptr<miniros::SteadyTimer::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  SVar1.impl_.super___shared_ptr<miniros::SteadyTimer::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SteadyTimer)
         SVar1.impl_.super___shared_ptr<miniros::SteadyTimer::Impl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SteadyTimer NodeHandle::createSteadyTimer(WallDuration period, const SteadyTimerCallback& callback,
                                          bool oneshot, bool autostart) const
{
  SteadyTimerOptions ops;
  ops.period = period;
  ops.callback = callback;
  ops.oneshot = oneshot;
  ops.autostart = autostart;
  return createSteadyTimer(ops);
}